

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

Arg * kj::_::
      CopyConstructArray_<kj::MainBuilder::Impl::Arg,_kj::MainBuilder::Impl::Arg_*,_true,_false>::
      apply(Arg *pos,Arg *start,Arg *end)

{
  size_t sVar1;
  Iface *pIVar2;
  uint uVar3;
  ExceptionGuard local_18;
  
  for (; start != end; start = start + 1) {
    sVar1 = (start->title).content.size_;
    (pos->title).content.ptr = (start->title).content.ptr;
    (pos->title).content.size_ = sVar1;
    pIVar2 = (start->callback).impl.ptr;
    (pos->callback).impl.disposer = (start->callback).impl.disposer;
    (pos->callback).impl.ptr = pIVar2;
    (start->callback).impl.ptr = (Iface *)0x0;
    uVar3 = start->maxCount;
    pos->minCount = start->minCount;
    pos->maxCount = uVar3;
    pos = pos + 1;
  }
  local_18.start = pos;
  local_18.pos = pos;
  ExceptionGuard::~ExceptionGuard(&local_18);
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }